

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnTryTableCatch(TypeChecker *this,TypeVector *sig,Index depth)

{
  _Alloc_hider _Var1;
  Result RVar2;
  TypeVector *prefix;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  bool bVar3;
  Label *label;
  Label *local_70;
  string local_68;
  string local_48;
  
  this_00 = this;
  RVar2 = GetLabel(this,depth,&local_70);
  bVar3 = true;
  if (RVar2.enum_ != Error) {
    prefix = &local_70->param_types;
    this_01 = (_anonymous_namespace_ *)&local_70->result_types;
    if (local_70->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)prefix;
    }
    RVar2 = CheckTypes(this_00,(TypeVector *)this_01,sig);
    bVar3 = RVar2.enum_ == Error;
    if (bVar3) {
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)sig,(TypeVector *)0x0,(char *)prefix);
      _Var1._M_p = local_48._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_68,this_01,(TypeVector *)0x0,(char *)prefix);
      PrintError(this,"catch signature doesn\'t match target: expected %s, got %s",_Var1._M_p,
                 local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar3;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnTryTableCatch(const TypeVector& sig, Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckTypes(label_sig, sig);
  if (Failed(result)) {
    PrintError("catch signature doesn't match target: expected %s, got %s",
               TypesToString(sig).c_str(), TypesToString(label_sig).c_str());
  }
  return result;
}